

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ball.cpp
# Opt level: O2

void __thiscall Ball::draw(Ball *this,Graphics *g)

{
  iterator *this_00;
  float a;
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  int i;
  long __n;
  vec4 color;
  vec4 color_00;
  vec4 color_01;
  float fStack_64;
  string local_50;
  
  piksel::Graphics::push(g);
  iVar1 = piksel::Graphics::millis(g);
  iVar1 = piksel::Timer::getElapsedTimeInMillis(&this->respawnTimer,iVar1);
  if (iVar1 < 3000) {
    color.field_0._8_8_ = 0x3f8000003f800000;
    color.field_0._0_8_ = 0x3f8000003f800000;
    piksel::Graphics::fill(g,color);
    piksel::Graphics::textSize(g,16.0);
    iVar1 = piksel::Graphics::millis(g);
    iVar1 = piksel::Timer::getElapsedTimeInMillis(&this->respawnTimer,iVar1);
    std::__cxx11::to_string(&local_50,iVar1 / -1000 + 3);
    piksel::Graphics::text
              (g,&local_50,
               (this->velocity).field_0.field_0.x * 4.0 +
               (this->super_AABB).center.field_0.field_0.x + -4.0,
               (this->velocity).field_0.field_0.y * 4.0 +
               (this->super_AABB).center.field_0.field_0.y + 8.0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  piksel::Graphics::rectMode(g,RADIUS);
  piksel::Graphics::noStroke(g);
  fStack_64 = 1.0;
  color_00.field_0._8_8_ = 0x3f8000003e969697;
  color_00.field_0._0_8_ = 0x3e9292933f46c6c7;
  piksel::Graphics::fill(g,color_00);
  piksel::Graphics::rect
            (g,(this->super_AABB).center.field_0.field_0.x,
             (this->super_AABB).center.field_0.field_0.y,
             (this->super_AABB).halfDimension.field_0.field_0.x,
             (this->super_AABB).halfDimension.field_0.field_0.y);
  this_00 = &(this->prevCenters).
             super__Deque_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Deque_impl_data._M_start;
  __n = 0;
  while( true ) {
    sVar2 = std::
            deque<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            ::size(&this->prevCenters);
    iVar1 = (int)sVar2;
    if (5 < iVar1) {
      iVar1 = 6;
    }
    if (iVar1 <= __n) break;
    fStack_64 = fStack_64 + -0.15;
    color_01.field_0.field_0.w = fStack_64;
    color_01.field_0.field_0.z = 0.29411766;
    color_01.field_0._0_8_ = 0x3e9292933f46c6c7;
    piksel::Graphics::fill(g,color_01);
    pvVar3 = std::
             _Deque_iterator<glm::vec<2,_float,_(glm::qualifier)0>,_glm::vec<2,_float,_(glm::qualifier)0>_&,_glm::vec<2,_float,_(glm::qualifier)0>_*>
             ::operator[](this_00,__n);
    a = (pvVar3->field_0).field_0.x;
    pvVar3 = std::
             _Deque_iterator<glm::vec<2,_float,_(glm::qualifier)0>,_glm::vec<2,_float,_(glm::qualifier)0>_&,_glm::vec<2,_float,_(glm::qualifier)0>_*>
             ::operator[](this_00,__n);
    piksel::Graphics::rect
              (g,a,(pvVar3->field_0).field_0.y,(this->super_AABB).halfDimension.field_0.field_0.x,
               (this->super_AABB).halfDimension.field_0.field_0.y);
    __n = __n + 1;
  }
  piksel::Graphics::pop(g);
  return;
}

Assistant:

void Ball::draw(piksel::Graphics& g) {
    g.push();
    if (respawnTimer.getElapsedTimeInMillis(g.millis()) < 3000) {
        g.fill(WHITE);
        g.textSize(16);
        g.text(std::to_string(3 - respawnTimer.getElapsedTimeInMillis(g.millis()) / 1000), center.x + 4.0f * velocity.x - 4.0f, center.y + 4.0f * velocity.y + 8.0f);
    }
    g.rectMode(piksel::DrawMode::RADIUS);
    g.noStroke();
    glm::vec4 color = RED;
    g.fill(color);
    g.rect(center.x, center.y, halfDimension.x, halfDimension.y);
    for (int i = 0; i < std::min<int>(prevCenters.size(), 6); i++) {
        color.a -= 0.15f;
        g.fill(color);
        g.rect(prevCenters[i].x, prevCenters[i].y, halfDimension.x, halfDimension.y);
    }
    g.pop();
}